

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Section::~Section(Section *this)

{
  bool bVar1;
  IResultCapture *pIVar2;
  SectionInfo *in_RDI;
  SectionEndInfo endInfo;
  SectionInfo *in_stack_ffffffffffffff60;
  SectionInfo *in_stack_ffffffffffffff78;
  undefined1 local_78 [80];
  size_type local_28;
  size_type sStack_20;
  undefined8 local_18;
  double local_10;
  
  *(undefined ***)&in_RDI->name = &PTR__Section_0037b9f8;
  if (((ulong)in_RDI[1].lineInfo.file & 1) != 0) {
    SectionInfo::SectionInfo(in_RDI,in_stack_ffffffffffffff78);
    local_18 = *(undefined8 *)((long)&in_RDI[1].description.field_2 + 8);
    local_28 = in_RDI[1].description._M_string_length;
    sStack_20 = in_RDI[1].description.field_2._M_allocated_capacity;
    local_10 = Timer::getElapsedSeconds((Timer *)0x25f465);
    bVar1 = uncaught_exceptions();
    if (bVar1) {
      in_stack_ffffffffffffff60 = (SectionInfo *)getResultCapture();
      (*(*(_func_int ***)&in_stack_ffffffffffffff60->name)[4])(in_stack_ffffffffffffff60,local_78);
    }
    else {
      pIVar2 = getResultCapture();
      (*pIVar2->_vptr_IResultCapture[3])(pIVar2,local_78);
    }
    SectionEndInfo::~SectionEndInfo((SectionEndInfo *)0x25f4df);
  }
  std::__cxx11::string::~string((string *)&in_RDI[1].name._M_string_length);
  SectionInfo::~SectionInfo(in_stack_ffffffffffffff60);
  NonCopyable::~NonCopyable((NonCopyable *)in_RDI);
  return;
}

Assistant:

Section::~Section() {
        if( m_sectionIncluded ) {
            SectionEndInfo endInfo{ m_info, m_assertions, m_timer.getElapsedSeconds() };
            if( uncaught_exceptions() )
                getResultCapture().sectionEndedEarly( endInfo );
            else
                getResultCapture().sectionEnded( endInfo );
        }
    }